

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O0

int intEventCallback(int pi,uint event,void *f,void *user,int ex)

{
  int iVar1;
  evtCallback_t *peVar2;
  void *in_RCX;
  CBF_t in_RDX;
  uint in_ESI;
  int in_EDI;
  int in_R8D;
  evtCallback_t *ep;
  int local_4;
  
  if ((in_ESI < 0x20) && (peVar2 = geCallBackFirst, in_RDX != (CBF_t)0x0)) {
    for (; peVar2 != (evtCallback_t *)0x0; peVar2 = peVar2->next) {
      if (((peVar2->pi == in_EDI) && (peVar2->event == in_ESI)) && (peVar2->f == in_RDX)) {
        return -0x7d6;
      }
    }
    peVar2 = (evtCallback_t *)malloc(0x38);
    if (peVar2 == (evtCallback_t *)0x0) {
      local_4 = -0x7d7;
    }
    else {
      if (geCallBackFirst == (evtCallback_t *)0x0) {
        geCallBackFirst = peVar2;
      }
      iVar1 = intEventCallback::id + 1;
      peVar2->id = intEventCallback::id;
      intEventCallback::id = iVar1;
      peVar2->pi = in_EDI;
      peVar2->event = in_ESI;
      peVar2->f = in_RDX;
      peVar2->user = in_RCX;
      peVar2->ex = in_R8D;
      peVar2->next = (evtCallback_t *)0x0;
      peVar2->prev = geCallBackLast;
      if (peVar2->prev != (evtCallback_t *)0x0) {
        peVar2->prev->next = peVar2;
      }
      geCallBackLast = peVar2;
      findEventBits((int)((ulong)peVar2 >> 0x20));
      local_4 = peVar2->id;
    }
  }
  else {
    local_4 = -0x7d8;
  }
  return local_4;
}

Assistant:

static int intEventCallback(
   int pi, unsigned event, void *f, void *user, int ex)
{
   static int id = 0;
   evtCallback_t *ep;

   if ((event >=0) && (event < 32) && f)
   {
      /* prevent duplicates */

      ep = geCallBackFirst;

      while (ep)
      {
         if ((ep->pi    == pi)    &&
             (ep->event == event) &&
             (ep->f     == f))
         {
            return pigif_duplicate_callback;
         }
         ep = ep->next;
      }

      ep = malloc(sizeof(evtCallback_t));

      if (ep)
      {
         if (!geCallBackFirst) geCallBackFirst = ep;

         ep->id = id++;
         ep->pi = pi;
         ep->event = event;
         ep->f = f;
         ep->user = user;
         ep->ex = ex;
         ep->next = 0;
         ep->prev = geCallBackLast;

         if (ep->prev) (ep->prev)->next = ep;
         geCallBackLast = ep;

         findEventBits(pi);

         return ep->id;
      }

      return pigif_bad_malloc;
   }

   return pigif_bad_callback;
}